

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O0

bool __thiscall
cmCMakeMinimumRequired::InitialPass
          (cmCMakeMinimumRequired *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  ostream *poVar9;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  string local_648;
  undefined1 local_628 [8];
  ostringstream e_2;
  string local_4b0;
  undefined1 local_490 [8];
  ostringstream e_1;
  uint local_314;
  uint local_310;
  uint required_tweak;
  uint required_patch;
  uint required_minor;
  uint required_major;
  uint current_tweak;
  uint current_patch;
  uint current_minor;
  uint current_major;
  string local_2d0;
  undefined1 local_2b0 [8];
  ostringstream e;
  undefined1 local_138 [8];
  string version_max;
  string version_min;
  size_type dd;
  allocator<char> local_c9;
  string local_c8;
  undefined4 local_a8;
  allocator<char> local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_48 [7];
  bool doing_version;
  string version_string;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakeMinimumRequired *this_local;
  
  version_string.field_2._8_8_ = param_2;
  std::__cxx11::string::string(local_48);
  bVar3 = false;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(args);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(args);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar2) {
    local_70 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar2 = std::operator==(local_70,"VERSION");
    if (bVar2) {
      bVar3 = true;
    }
    else {
      bVar2 = std::operator==(local_70,"FATAL_ERROR");
      if (bVar2) {
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"called with no value for VERSION.",&local_a1);
          cmCommand::SetError(&this->super_cmCommand,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          this_local._7_1_ = false;
          local_a8 = 1;
          goto LAB_0027f882;
        }
        bVar3 = false;
      }
      else if (bVar3) {
        bVar3 = false;
        std::__cxx11::string::operator=(local_48,(string *)local_70);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->UnknownArguments,local_70);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"called with no value for VERSION.",&local_c9);
    cmCommand::SetError(&this->super_cmCommand,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    this_local._7_1_ = false;
    local_a8 = 1;
    goto LAB_0027f882;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::string::string((string *)&dd);
    this_local._7_1_ = EnforceUnknownArguments(this,(string *)&dd);
    std::__cxx11::string::~string((string *)&dd);
    local_a8 = 1;
    goto LAB_0027f882;
  }
  lVar6 = std::__cxx11::string::find((char *)local_48,0x7a3f6f);
  std::__cxx11::string::substr((ulong)((long)&version_max.field_2 + 8),(ulong)local_48);
  if (lVar6 == -1) {
    std::__cxx11::string::string((string *)local_138);
LAB_0027f237:
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&current_major,"CMAKE_MINIMUM_REQUIRED_VERSION",
               (allocator<char> *)((long)&current_minor + 3));
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)&current_major,pcVar7);
    std::__cxx11::string::~string((string *)&current_major);
    std::allocator<char>::~allocator((allocator<char> *)((long)&current_minor + 3));
    current_patch = cmVersion::GetMajorVersion();
    current_tweak = cmVersion::GetMinorVersion();
    required_major = cmVersion::GetPatchVersion();
    required_minor = cmVersion::GetTweakVersion();
    required_patch = 0;
    required_tweak = 0;
    local_310 = 0;
    local_314 = 0;
    uVar8 = std::__cxx11::string::c_str();
    iVar4 = __isoc99_sscanf(uVar8,"%u.%u.%u.%u",&required_patch,&required_tweak,&local_310,
                            &local_314);
    if (iVar4 < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_490);
      poVar9 = std::operator<<((ostream *)local_490,"could not parse VERSION \"");
      poVar9 = std::operator<<(poVar9,(string *)(version_max.field_2._M_local_buf + 8));
      std::operator<<(poVar9,"\".");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      this_local._7_1_ = false;
      local_a8 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_490);
    }
    else if ((((current_patch < required_patch) ||
              ((current_patch == required_patch && (current_tweak < required_tweak)))) ||
             ((current_patch == required_patch &&
              ((current_tweak == required_tweak && (required_major < local_310)))))) ||
            ((current_patch == required_patch &&
             (((current_tweak == required_tweak && (required_major == local_310)) &&
              (required_minor < local_314)))))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      poVar9 = std::operator<<((ostream *)local_628,"CMake ");
      poVar9 = std::operator<<(poVar9,(string *)(version_max.field_2._M_local_buf + 8));
      poVar9 = std::operator<<(poVar9," or higher is required.  You are running version ");
      pcVar7 = cmVersion::GetCMakeVersion();
      std::operator<<(poVar9,pcVar7);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = true;
      local_a8 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    }
    else {
      bVar3 = EnforceUnknownArguments(this,(string *)local_138);
      if (bVar3) {
        if ((required_patch < 2) || ((required_patch == 2 && (required_tweak < 4)))) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,
                     "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.",&local_669);
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::allocator<char>::~allocator(&local_669);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"2.4",&local_691);
          cmMakefile::SetPolicyVersion(pcVar1,&local_690,(string *)local_138);
          std::__cxx11::string::~string((string *)&local_690);
          std::allocator<char>::~allocator(&local_691);
        }
        else {
          cmMakefile::SetPolicyVersion
                    ((this->super_cmCommand).Makefile,(string *)((long)&version_max.field_2 + 8),
                     (string *)local_138);
        }
        this_local._7_1_ = true;
        local_a8 = 1;
      }
      else {
        this_local._7_1_ = false;
        local_a8 = 1;
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_138,(ulong)local_48);
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0))
    goto LAB_0027f237;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    poVar9 = std::operator<<((ostream *)local_2b0,"VERSION \"");
    poVar9 = std::operator<<(poVar9,local_48);
    std::operator<<(poVar9,"\" does not have a version on both sides of \"...\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    this_local._7_1_ = false;
    local_a8 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
  }
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)(version_max.field_2._M_local_buf + 8));
LAB_0027f882:
  std::__cxx11::string::~string(local_48);
  return this_local._7_1_;
}

Assistant:

bool cmCMakeMinimumRequired::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  // Process arguments.
  std::string version_string;
  bool doing_version = false;
  for (std::string const& arg : args) {
    if (arg == "VERSION") {
      doing_version = true;
    } else if (arg == "FATAL_ERROR") {
      if (doing_version) {
        this->SetError("called with no value for VERSION.");
        return false;
      }
      doing_version = false;
    } else if (doing_version) {
      doing_version = false;
      version_string = arg;
    } else {
      this->UnknownArguments.push_back(arg);
    }
  }
  if (doing_version) {
    this->SetError("called with no value for VERSION.");
    return false;
  }

  // Make sure there was a version to check.
  if (version_string.empty()) {
    return this->EnforceUnknownArguments(std::string());
  }

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    std::ostringstream e;
    e << "VERSION \"" << version_string
      << "\" does not have a version on both sides of \"...\".";
    this->SetError(e.str());
    return false;
  }

  // Save the required version string.
  this->Makefile->AddDefinition("CMAKE_MINIMUM_REQUIRED_VERSION",
                                version_min.c_str());

  // Get the current version number.
  unsigned int current_major = cmVersion::GetMajorVersion();
  unsigned int current_minor = cmVersion::GetMinorVersion();
  unsigned int current_patch = cmVersion::GetPatchVersion();
  unsigned int current_tweak = cmVersion::GetTweakVersion();

  // Parse at least two components of the version number.
  // Use zero for those not specified.
  unsigned int required_major = 0;
  unsigned int required_minor = 0;
  unsigned int required_patch = 0;
  unsigned int required_tweak = 0;
  if (sscanf(version_min.c_str(), "%u.%u.%u.%u", &required_major,
             &required_minor, &required_patch, &required_tweak) < 2) {
    std::ostringstream e;
    e << "could not parse VERSION \"" << version_min << "\".";
    this->SetError(e.str());
    return false;
  }

  // Compare the version numbers.
  if ((current_major < required_major) ||
      (current_major == required_major && current_minor < required_minor) ||
      (current_major == required_major && current_minor == required_minor &&
       current_patch < required_patch) ||
      (current_major == required_major && current_minor == required_minor &&
       current_patch == required_patch && current_tweak < required_tweak)) {
    // The current version is too low.
    std::ostringstream e;
    e << "CMake " << version_min
      << " or higher is required.  You are running version "
      << cmVersion::GetCMakeVersion();
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  // The version is not from the future, so enforce unknown arguments.
  if (!this->EnforceUnknownArguments(version_max)) {
    return false;
  }

  if (required_major < 2 || (required_major == 2 && required_minor < 4)) {
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.");
    this->Makefile->SetPolicyVersion("2.4", version_max);
  } else {
    this->Makefile->SetPolicyVersion(version_min, version_max);
  }

  return true;
}